

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::SetExceptionAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  bool bVar1;
  TTDVar origVar;
  ScriptContext *pSVar2;
  int64 iVar3;
  Recycler *pRVar4;
  JavascriptExceptionObject *this;
  TrackAllocData local_70;
  JavascriptExceptionObject *local_48;
  JavascriptExceptionObject *exceptionObject;
  RecyclableObject *pRStack_38;
  bool propagateToDebugger;
  RecyclableObject *__obj;
  Var exception;
  JsRTSingleVarScalarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  ctx = (ScriptContext *)executeContext;
  executeContext_local = (ThreadContextTTD *)evt;
  action = (JsRTSingleVarScalarArgumentAction *)
           ThreadContextTTD::GetActiveScriptContext(executeContext);
  if ((ScriptContext *)action != (ScriptContext *)0x0) {
    exception = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)44>
                          ((EventLogEntry *)executeContext_local);
    pSVar2 = ctx;
    origVar = GetVarItem_0<1ul,1ul>
                        ((JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *)exception);
    __obj = (RecyclableObject *)InflateVarInReplay((ThreadContextTTD *)pSVar2,origVar);
    if (__obj != (RecyclableObject *)0x0) {
      bVar1 = Js::VarIs<Js::RecyclableObject>(__obj);
      if (bVar1) {
        pRStack_38 = Js::VarTo<Js::RecyclableObject>(__obj);
        pSVar2 = Js::RecyclableObject::GetScriptContext(pRStack_38);
        if (pSVar2 != (ScriptContext *)action) {
          __obj = (RecyclableObject *)
                  Js::CrossSite::MarshalVar((ScriptContext *)action,pRStack_38,false);
        }
      }
      iVar3 = GetScalarItem_0<1ul,1ul>
                        ((JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *)exception);
      exceptionObject._7_1_ = iVar3 != 0;
      pRVar4 = Js::ScriptContext::GetRecycler((ScriptContext *)action);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_70,(type_info *)&Js::JavascriptExceptionObject::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                 ,0x1d9);
      pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_70);
      this = (JavascriptExceptionObject *)new<Memory::Recycler>(0x50,pRVar4,0x43c4b0);
      Js::JavascriptExceptionObject::JavascriptExceptionObject
                (this,__obj,(ScriptContext *)action,(JavascriptExceptionContext *)0x0,false);
      local_48 = this;
      Js::ScriptContext::RecordException
                ((ScriptContext *)action,this,(bool)(exceptionObject._7_1_ & 1));
    }
    return;
  }
  TTDAbort_unrecoverable_error("This should be non-null!!!");
}

Assistant:

void SetExceptionAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarScalarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarScalarArgumentAction, EventKind::SetExceptionActionTag>(evt);
            Js::Var exception = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(exception, ctx);

            bool propagateToDebugger = GetScalarItem_0(action) ? true : false;

            Js::JavascriptExceptionObject *exceptionObject;
            exceptionObject = RecyclerNew(ctx->GetRecycler(), Js::JavascriptExceptionObject, exception, ctx, nullptr);

            ctx->RecordException(exceptionObject, propagateToDebugger);
        }